

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableWidgetPrivate::emitItemChanged(QTableWidgetPrivate *this,QModelIndex *index)

{
  QTableWidget *this_00;
  QTableModel *this_01;
  QTableWidgetItem *_t1;
  
  this_00 = *(QTableWidget **)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  this_01 = tableModel(this);
  _t1 = QTableModel::item(this_01,index);
  if (_t1 != (QTableWidgetItem *)0x0) {
    QTableWidget::itemChanged(this_00,_t1);
  }
  QTableWidget::cellChanged(this_00,index->r,index->c);
  return;
}

Assistant:

void QTableWidgetPrivate::emitItemChanged(const QModelIndex &index)
{
    Q_Q(QTableWidget);
    if (QTableWidgetItem *item = tableModel()->item(index))
        emit q->itemChanged(item);
    emit q->cellChanged(index.row(), index.column());
}